

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O3

btCollisionShape * __thiscall
btCollisionWorldImporter::createConeShapeY
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape **ptr;
  uint uVar1;
  btConeShape *this_00;
  btCollisionShape **ppbVar2;
  ulong uVar3;
  int iVar4;
  
  this_00 = (btConeShape *)btAlignedAllocInternal(0x60,0x10);
  btConeShape::btConeShape(this_00,radius,height);
  uVar1 = (this->m_allocatedCollisionShapes).m_size;
  if (uVar1 == (this->m_allocatedCollisionShapes).m_capacity) {
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if ((int)uVar1 < iVar4) {
      if (iVar4 == 0) {
        ppbVar2 = (btCollisionShape **)0x0;
      }
      else {
        ppbVar2 = (btCollisionShape **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
        uVar1 = (this->m_allocatedCollisionShapes).m_size;
      }
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          ppbVar2[uVar3] = (this->m_allocatedCollisionShapes).m_data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      ptr = (this->m_allocatedCollisionShapes).m_data;
      if ((ptr != (btCollisionShape **)0x0) &&
         ((this->m_allocatedCollisionShapes).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
        uVar1 = (this->m_allocatedCollisionShapes).m_size;
      }
      (this->m_allocatedCollisionShapes).m_ownsMemory = true;
      (this->m_allocatedCollisionShapes).m_data = ppbVar2;
      (this->m_allocatedCollisionShapes).m_capacity = iVar4;
    }
  }
  (this->m_allocatedCollisionShapes).m_data[(int)uVar1] = (btCollisionShape *)this_00;
  (this->m_allocatedCollisionShapes).m_size = uVar1 + 1;
  return (btCollisionShape *)this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createConeShapeY(btScalar radius,btScalar height)
{
	btConeShape* shape = new btConeShape(radius,height);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}